

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O3

int XMLDoc_parse_buffer_DOM_text_as_nodes
              (SXML_CHAR *buffer,SXML_CHAR *name,XMLDoc *doc,int text_as_nodes)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  DOM_through_SAX dom;
  SAX_Callbacks sax;
  XMLDoc *local_80;
  undefined8 local_78;
  int local_68;
  SAX_Callbacks local_60;
  
  iVar2 = 0;
  if ((buffer != (SXML_CHAR *)0x0 && doc != (XMLDoc *)0x0) &&
     (iVar2 = 0, doc->init_value == 0x19770522)) {
    local_78 = 0;
    local_60.start_doc = DOMXMLDoc_doc_start;
    local_60.start_node = DOMXMLDoc_node_start;
    local_60.end_node = DOMXMLDoc_node_end;
    local_60.new_text = DOMXMLDoc_node_text;
    local_60.on_error = DOMXMLDoc_parse_error;
    local_60.end_doc = DOMXMLDoc_doc_end;
    local_60.all_event = (_func_int_XMLEvent_XMLNode_ptr_SXML_CHAR_ptr_int_SAX_Data_ptr *)0x0;
    local_80 = doc;
    local_68 = text_as_nodes;
    sVar3 = strlen(buffer);
    iVar1 = XMLDoc_parse_buffer_SAX_len(buffer,(int)sVar3,name,&local_60,&local_80);
    iVar2 = 1;
    if (iVar1 == 0) {
      XMLDoc_free(doc);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int XMLDoc_parse_buffer_DOM_text_as_nodes(const SXML_CHAR* buffer, const SXML_CHAR* name, XMLDoc* doc, int text_as_nodes)
{
	DOM_through_SAX dom;
	SAX_Callbacks sax;
	int ret;

	if (doc == NULL || buffer == NULL || doc->init_value != XML_INIT_DONE)
		return FALSE;

	dom.doc = doc;
	dom.current = NULL;
	dom.text_as_nodes = text_as_nodes;
	SAX_Callbacks_init_DOM(&sax);

	ret = XMLDoc_parse_buffer_SAX(buffer, name, &sax, &dom);
	if (!ret) {
		XMLDoc_free(doc);
		return ret;
	}

	/* TODO: Check there is no unfinished root nodes */
	return ret;
}